

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall ValueSymbol::~ValueSymbol(ValueSymbol *this)

{
  ValueSymbol *this_local;
  
  (this->super_FamilySymbol).super_TripleSymbol.super_SleighSymbol._vptr_SleighSymbol =
       (_func_int **)&PTR__ValueSymbol_00858488;
  if (this->patval != (PatternValue *)0x0) {
    PatternExpression::release(&this->patval->super_PatternExpression);
  }
  FamilySymbol::~FamilySymbol(&this->super_FamilySymbol);
  return;
}

Assistant:

ValueSymbol::~ValueSymbol(void)

{
  if (patval != (PatternValue *)0)
    PatternExpression::release(patval);
}